

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void __thiscall
Inline::InsertOneInlinee
          (Inline *this,Instr *callInstr,RegOpnd *returnValueOpnd,Opnd *methodOpnd,
          FunctionJITTimeInfo *inlineeJITData,FunctionJITRuntimeInfo *inlineeRuntimeData,
          LabelInstr *doneLabel,StackSym *symCallerThis,bool fixedFunctionSafeThis,
          uint recursiveInlineDepth)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  uint actualCount_00;
  RegOpnd *dstOpnd;
  JITTimeFunctionBody *funcBody_00;
  Func *inlinee_00;
  ProfiledInstr *pPVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  Instr *this_00;
  Instr *instr;
  IntConstOpnd *newSrc;
  BranchInstr *pBVar7;
  RegSlot local_124;
  Instr *doneInstr;
  Instr *inlineeEndInstr;
  ArgSlot actualCount;
  bool stackArgsArgOutExpanded;
  Instr *argOuts [15];
  Func *inlinee;
  JITTimeFunctionBody *funcBody;
  Instr *currentCallInstr;
  bool isInlined;
  bool fixedFunctionSafeThis_local;
  FunctionJITRuntimeInfo *inlineeRuntimeData_local;
  FunctionJITTimeInfo *inlineeJITData_local;
  Opnd *methodOpnd_local;
  RegOpnd *returnValueOpnd_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  bVar2 = FunctionJITTimeInfo::IsInlined(inlineeJITData);
  if (bVar2) {
    dstOpnd = IR::RegOpnd::New(TyVar,callInstr->m_func);
    funcBody = (JITTimeFunctionBody *)
               IR::Instr::New(InlineeStart,&dstOpnd->super_Opnd,methodOpnd,callInstr->m_func);
  }
  else {
    funcBody = (JITTimeFunctionBody *)IR::Instr::New(callInstr->m_opcode,callInstr->m_func);
    IR::Instr::SetByteCodeOffset((Instr *)funcBody,callInstr);
    IR::Instr::SetSrc1((Instr *)funcBody,methodOpnd);
    if (returnValueOpnd != (RegOpnd *)0x0) {
      IR::Instr::SetDst((Instr *)funcBody,&returnValueOpnd->super_Opnd);
    }
  }
  IR::Instr::SetIsCloned((Instr *)funcBody,true);
  IR::Instr::InsertBefore(callInstr,(Instr *)funcBody);
  CloneCallSequence(this,callInstr,(Instr *)funcBody);
  if (bVar2) {
    funcBody_00 = FunctionJITTimeInfo::GetBody(inlineeJITData);
    if (returnValueOpnd == (RegOpnd *)0x0) {
      local_124 = 0xffffffff;
    }
    else {
      local_124 = StackSym::GetByteCodeRegSlot(returnValueOpnd->m_sym);
    }
    inlinee_00 = BuildInlinee(this,funcBody_00,inlineeJITData,inlineeRuntimeData,local_124,callInstr
                              ,recursiveInlineDepth);
    memset(&stack0xffffffffffffff18,0xfe,0x78);
    inlineeEndInstr._7_1_ = 0;
    pPVar4 = IR::Instr::AsProfiledInstr(callInstr);
    inlineeEndInstr._4_2_ =
         MapActuals(this,(Instr *)funcBody,(Instr **)&stack0xffffffffffffff18,0xf,inlinee_00,
                    (pPVar4->u).field_3.fldInfoData.f1,(bool *)((long)&inlineeEndInstr + 7),
                    (Instr **)0x0,0xf);
    if (inlineeEndInstr._4_2_ == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x54e,"(actualCount > 0)","actualCount > 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    AVar3 = JITTimeFunctionBody::GetInParamsCount(funcBody_00);
    actualCount_00 = (uint)inlineeEndInstr._4_2_;
    pOVar6 = IR::Instr::GetSrc1((Instr *)funcBody);
    MapFormals(this,inlinee_00,(Instr **)&stack0xffffffffffffff18,(uint)AVar3,actualCount_00,
               returnValueOpnd,pOVar6,symCallerThis,(bool)(inlineeEndInstr._7_1_ & 1),
               fixedFunctionSafeThis,(Instr **)&stack0xffffffffffffff18);
    Func::SetInlineeStart(inlinee_00,(Instr *)funcBody);
    AVar3 = inlineeEndInstr._4_2_;
    *(Func **)&(funcBody->m_bodyData).profiledCallApplyCallSiteCount = inlinee_00;
    pOVar6 = IR::Instr::GetSrc1((Instr *)funcBody);
    SetupInlineeFrame(this,inlinee_00,(Instr *)funcBody,AVar3,pOVar6);
    this_00 = IR::Instr::New(InlineeEnd,inlinee_00);
    instr = IR::Instr::GetPrevRealInstr(inlinee_00->m_tailInstr);
    IR::Instr::SetByteCodeOffset(this_00,instr);
    newSrc = IR::IntConstOpnd::New((ulong)(inlineeEndInstr._4_2_ + 3),TyInt32,inlinee_00,false);
    IR::Instr::SetSrc1(this_00,&newSrc->super_Opnd);
    pOVar6 = IR::Instr::GetDst((Instr *)funcBody);
    IR::Instr::SetSrc2(this_00,pOVar6);
    IR::Instr::InsertBefore(inlinee_00->m_tailInstr,this_00);
    pBVar7 = IR::BranchInstr::New
                       (Br,doneLabel,
                        *(Func **)&(funcBody->m_bodyData).profiledCallApplyCallSiteCount);
    IR::Instr::InsertBefore(inlinee_00->m_tailInstr,&pBVar7->super_Instr);
    IR::Instr::InsertRangeAfter
              ((Instr *)funcBody,inlinee_00->m_headInstr->m_next,inlinee_00->m_tailInstr->m_prev);
    IR::Instr::Free(inlinee_00->m_headInstr);
    IR::Instr::Free(inlinee_00->m_tailInstr);
  }
  else {
    pBVar7 = IR::BranchInstr::New(Br,doneLabel,callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,&pBVar7->super_Instr);
  }
  return;
}

Assistant:

void Inline::InsertOneInlinee(IR::Instr* callInstr, IR::RegOpnd* returnValueOpnd, IR::Opnd* methodOpnd,
    const FunctionJITTimeInfo * inlineeJITData, const FunctionJITRuntimeInfo * inlineeRuntimeData, IR::LabelInstr* doneLabel, const StackSym* symCallerThis, bool fixedFunctionSafeThis, uint recursiveInlineDepth)
{
    bool isInlined = inlineeJITData->IsInlined();

    IR::Instr* currentCallInstr;
    if (isInlined)
    {
        currentCallInstr = IR::Instr::New(Js::OpCode::InlineeStart, IR::RegOpnd::New(TyVar, callInstr->m_func), methodOpnd, callInstr->m_func);
    }
    else
    {
        currentCallInstr = IR::Instr::New(callInstr->m_opcode, callInstr->m_func);
        currentCallInstr->SetByteCodeOffset(callInstr);
        currentCallInstr->SetSrc1(methodOpnd);
        if (returnValueOpnd)
        {
            currentCallInstr->SetDst(returnValueOpnd);
        }
    }
    currentCallInstr->SetIsCloned(true);
    callInstr->InsertBefore(currentCallInstr);
    this->CloneCallSequence(callInstr, currentCallInstr);

    if (isInlined)
    {
        JITTimeFunctionBody *funcBody = inlineeJITData->GetBody();
        Func *inlinee = BuildInlinee(funcBody, inlineeJITData, inlineeRuntimeData, returnValueOpnd ? returnValueOpnd->m_sym->GetByteCodeRegSlot() : Js::Constants::NoRegister, callInstr, recursiveInlineDepth);

        IR::Instr *argOuts[Js::InlineeCallInfo::MaxInlineeArgoutCount];
#if DBG
        memset(argOuts, 0xFE, sizeof(argOuts));
#endif
        bool stackArgsArgOutExpanded = false;
        Js::ArgSlot actualCount = MapActuals(currentCallInstr, argOuts, Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinee, (Js::ProfileId)callInstr->AsProfiledInstr()->u.profileId, &stackArgsArgOutExpanded);
        Assert(actualCount > 0);
        MapFormals(inlinee, argOuts, funcBody->GetInParamsCount(), actualCount, returnValueOpnd, currentCallInstr->GetSrc1(), symCallerThis, stackArgsArgOutExpanded, fixedFunctionSafeThis, argOuts);
        inlinee->SetInlineeStart(currentCallInstr);
        currentCallInstr->m_func = inlinee;

        // Put the meta arguments that the stack walker expects to find on the stack.
        // As all the argouts are shared among the inlinees, do this only once.
        SetupInlineeFrame(inlinee, currentCallInstr, actualCount, currentCallInstr->GetSrc1());
        
        IR::Instr* inlineeEndInstr = IR::Instr::New(Js::OpCode::InlineeEnd, inlinee);
        inlineeEndInstr->SetByteCodeOffset(inlinee->m_tailInstr->GetPrevRealInstr());
        inlineeEndInstr->SetSrc1(IR::IntConstOpnd::New(actualCount + Js::Constants::InlineeMetaArgCount, TyInt32, inlinee));
        inlineeEndInstr->SetSrc2(currentCallInstr->GetDst());
        inlinee->m_tailInstr->InsertBefore(inlineeEndInstr);

        // JMP to done at the end
        IR::Instr* doneInstr = IR::BranchInstr::New(Js::OpCode::Br, doneLabel, currentCallInstr->m_func);
        inlinee->m_tailInstr->InsertBefore(doneInstr);
        currentCallInstr->InsertRangeAfter(inlinee->m_headInstr->m_next, inlinee->m_tailInstr->m_prev);

        inlinee->m_headInstr->Free();
        inlinee->m_tailInstr->Free();
    }
    else
    {
        callInstr->InsertBefore(IR::BranchInstr::New(Js::OpCode::Br, doneLabel, callInstr->m_func));
    }
}